

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

char * blogc_content_parse(char *src,size_t *end_excerpt,char **first_header,char **description,
                          char **endl,bc_slist_t **headers)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  bc_string_t *str;
  bc_slist_t *pbVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  bc_string_t *pbVar8;
  char *pcVar9;
  bool bVar10;
  size_t local_210;
  size_t local_208;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1a0;
  size_t local_198;
  size_t local_180;
  size_t local_178;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  bc_slist_t *local_128;
  bc_slist_t *l_7;
  bc_slist_t *l_6;
  bc_slist_t *l_5;
  bc_slist_t *l_4;
  bc_slist_t *l_3;
  bc_slist_t *l_2;
  char *tmp_line;
  bc_slist_t *l_1;
  bc_slist_t *l;
  _Bool is_last;
  char c;
  blogc_content_parser_state_t state;
  bc_string_t *tmp_str;
  bc_string_t *rv;
  bc_slist_t *lines2;
  bc_slist_t *lines;
  char d;
  char *pcStack_b0;
  _Bool line_ending_found;
  char *line_ending;
  char *slug;
  char *parsed;
  char *tmp2;
  char *tmp;
  size_t prefix_len;
  char *prefix;
  size_t header_level;
  size_t real_end;
  size_t eend;
  size_t end;
  size_t start2;
  size_t start;
  size_t current;
  size_t src_len;
  bc_slist_t **headers_local;
  char **endl_local;
  char **description_local;
  char **first_header_local;
  size_t *end_excerpt_local;
  char *src_local;
  
  sVar2 = strlen(src);
  start = 0;
  start2 = 0;
  end = 0;
  eend = 0;
  real_end = 0;
  header_level = 0;
  prefix = (char *)0x0;
  prefix_len = 0;
  tmp = (char *)0x0;
  lines._7_1_ = false;
  if (endl == (char **)0x0) {
    pcStack_b0 = (char *)bc_malloc(3);
  }
  else {
    pcVar9 = *endl;
    if (pcVar9 == (char *)0x0) {
      pcVar3 = (char *)bc_malloc(3);
      *endl = pcVar3;
    }
    lines._7_1_ = pcVar9 != (char *)0x0;
    pcStack_b0 = *endl;
  }
  if (!lines._7_1_) {
    *pcStack_b0 = '\n';
    pcStack_b0[1] = '\0';
  }
  lines._6_1_ = '\0';
  lines2 = (bc_slist_t *)0x0;
  rv = (bc_string_t *)0x0;
  str = bc_string_new();
  l._4_4_ = 1;
LAB_001080f1:
  if (sVar2 <= start) {
    if (endl == (char **)0x0) {
      free(pcStack_b0);
    }
    pcVar9 = bc_string_free(str,false);
    return pcVar9;
  }
  l._3_1_ = src[start];
  bVar10 = start == sVar2 - 1;
  if ((l._3_1_ == '\n') || (l._3_1_ == '\r')) {
    if ((start + 1 < sVar2) &&
       (((l._3_1_ == '\n' && (src[start + 1] == '\r')) ||
        ((l._3_1_ == '\r' && (src[start + 1] == '\n')))))) {
      if (!lines._7_1_) {
        *pcStack_b0 = l._3_1_;
        pcStack_b0[1] = src[start + 1];
        pcStack_b0[2] = '\0';
        lines._7_1_ = true;
      }
      header_level = start;
      l._3_1_ = src[start + 1];
      bVar10 = start + 1 == sVar2 - 1;
      start = start + 1;
    }
    if (!lines._7_1_) {
      *pcStack_b0 = l._3_1_;
      pcStack_b0[1] = '\0';
      lines._7_1_ = true;
    }
  }
  switch(l._4_4_) {
  case 1:
    if (((l._3_1_ != '\n') && (l._3_1_ != '\r')) && (!bVar10)) {
      start2 = start;
      if ((l._3_1_ == '.') && (end_excerpt != (size_t *)0x0)) {
        real_end = str->len;
        l._4_4_ = 2;
      }
      else if (l._3_1_ == '#') {
        prefix = (char *)0x1;
        l._4_4_ = 4;
      }
      else if (((l._3_1_ == '*') || (l._3_1_ == '+')) || (l._3_1_ == '-')) {
        end = start;
        l._4_4_ = 0xf;
        lines._6_1_ = l._3_1_;
      }
      else if ((l._3_1_ < '0') || ('9' < l._3_1_)) {
        if ((l._3_1_ == ' ') || (l._3_1_ == '\t')) {
          end = start;
          l._4_4_ = 0xc;
        }
        else if (l._3_1_ == '<') {
          l._4_4_ = 7;
        }
        else if (l._3_1_ == '>') {
          l._4_4_ = 9;
          end = start;
        }
        else {
          l._4_4_ = 0x18;
        }
      }
      else {
        end = start;
        l._4_4_ = 0x14;
      }
    }
    break;
  case 2:
    if (end_excerpt == (size_t *)0x0) {
LAB_0010842d:
      real_end = 0;
      l._4_4_ = 0x18;
    }
    else if (l._3_1_ != '.') {
      if ((l._3_1_ != '\n') && (l._3_1_ != '\r')) goto LAB_0010842d;
      l._4_4_ = 3;
    }
    break;
  case 3:
    if ((end_excerpt == (size_t *)0x0) || ((l._3_1_ != '\n' && (l._3_1_ != '\r')))) {
      real_end = 0;
      l._4_4_ = 0x19;
    }
    else {
      *end_excerpt = real_end;
      l._4_4_ = 1;
    }
    break;
  case 4:
    if (l._3_1_ == '#') {
      prefix = prefix + 1;
    }
    else if ((l._3_1_ == ' ') || (l._3_1_ == '\t')) {
      l._4_4_ = 5;
    }
    else {
      l._4_4_ = 0x18;
    }
    break;
  case 5:
    if ((l._3_1_ != ' ') && (l._3_1_ != '\t')) {
      start2 = start;
      if ((l._3_1_ == '\n') || (l._3_1_ == '\r')) goto switchD_00108274_caseD_6;
      l._4_4_ = 6;
    }
    break;
  case 6:
switchD_00108274_caseD_6:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_138 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_140 = start;
        }
        else {
          local_140 = header_level;
        }
        local_138 = local_140;
      }
      eend = local_138;
      pcVar9 = bc_strndup(src + start2,local_138 - start2);
      if ((first_header != (char **)0x0) && (*first_header == (char *)0x0)) {
        pcVar3 = blogc_htmlentities(pcVar9);
        *first_header = pcVar3;
      }
      pcVar3 = blogc_content_parse_inline(pcVar9);
      pcVar7 = blogc_slugify(pcVar9);
      if (headers != (bc_slist_t **)0x0) {
        pbVar4 = blogc_toctree_append(*headers,(size_t)prefix,pcVar7,pcVar3);
        *headers = pbVar4;
      }
      if (pcVar7 == (char *)0x0) {
        bc_string_append_printf(str,"<h%d>%s</h%d>%s",prefix,pcVar3,prefix,pcStack_b0);
      }
      else {
        bc_string_append_printf
                  (str,"<h%d id=\"%s\">%s</h%d>%s",prefix,pcVar7,pcVar3,prefix,pcStack_b0);
      }
      free(pcVar7);
      free(pcVar3);
      free(pcVar9);
      l._4_4_ = 1;
      start2 = start;
    }
    break;
  case 7:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      l._4_4_ = 8;
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_148 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_150 = start;
        }
        else {
          local_150 = header_level;
        }
        local_148 = local_150;
      }
      eend = local_148;
    }
    if (bVar10) goto switchD_00108274_caseD_8;
    break;
  case 8:
switchD_00108274_caseD_8:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      pcVar9 = bc_strndup(src + start2,eend - start2);
      bc_string_append_printf(str,"%s%s",pcVar9,pcStack_b0);
      free(pcVar9);
      l._4_4_ = 1;
      start2 = start;
    }
    else {
      l._4_4_ = 7;
    }
    break;
  case 9:
    if ((l._3_1_ != ' ') && (l._3_1_ != '\t')) {
      prefix_len = (size_t)bc_strndup(src + start2,start - start2);
      l._4_4_ = 10;
    }
    break;
  case 10:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_158 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_160 = start;
        }
        else {
          local_160 = header_level;
        }
        local_158 = local_160;
      }
      eend = local_158;
      pcVar9 = bc_strndup(src + end,local_158 - end);
      _Var1 = bc_str_starts_with(pcVar9,(char *)prefix_len);
      if (_Var1) {
        sVar5 = strlen((char *)prefix_len);
        pcVar3 = bc_strdup(pcVar9 + sVar5);
        lines2 = bc_slist_append(lines2,pcVar3);
        l._4_4_ = 0xb;
      }
      else {
        l._4_4_ = 0x18;
        free((void *)prefix_len);
        prefix_len = 0;
        bc_slist_free_full(lines2,free);
        lines2 = (bc_slist_t *)0x0;
        if (bVar10) {
          free(pcVar9);
          goto LAB_001080f1;
        }
      }
      free(pcVar9);
    }
    if (bVar10) goto switchD_00108274_caseD_b;
    break;
  case 0xb:
switchD_00108274_caseD_b:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      pbVar8 = bc_string_new();
      for (l_1 = lines2; l_1 != (bc_slist_t *)0x0; l_1 = l_1->next) {
        bc_string_append_printf(pbVar8,"%s%s",l_1->data,pcStack_b0);
      }
      pcVar9 = blogc_content_parse(pbVar8->str,(size_t *)0x0,(char **)0x0,(char **)0x0,endl,
                                   (bc_slist_t **)0x0);
      bc_string_append_printf(str,"<blockquote>%s</blockquote>%s",pcVar9,pcStack_b0);
      free(pcVar9);
      bc_string_free(pbVar8,true);
      bc_slist_free_full(lines2,free);
      lines2 = (bc_slist_t *)0x0;
      free((void *)prefix_len);
      prefix_len = 0;
      l._4_4_ = 1;
      end = start;
    }
    else {
      l._4_4_ = 10;
      end = start;
    }
    break;
  case 0xc:
    if ((l._3_1_ != ' ') && (l._3_1_ != '\t')) {
      prefix_len = (size_t)bc_strndup(src + start2,start - start2);
      l._4_4_ = 0xd;
    }
    break;
  case 0xd:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_178 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_180 = start;
        }
        else {
          local_180 = header_level;
        }
        local_178 = local_180;
      }
      eend = local_178;
      pcVar9 = bc_strndup(src + end,local_178 - end);
      _Var1 = bc_str_starts_with(pcVar9,(char *)prefix_len);
      if (!_Var1) {
        l._4_4_ = 0x18;
        free((void *)prefix_len);
        bc_slist_free_full(lines2,free);
        free(pcVar9);
joined_r0x0010937f:
        lines2 = (bc_slist_t *)0x0;
        prefix_len = 0;
        if (!bVar10) break;
        goto LAB_001080f1;
      }
      sVar5 = strlen((char *)prefix_len);
      pcVar3 = bc_strdup(pcVar9 + sVar5);
      lines2 = bc_slist_append(lines2,pcVar3);
      l._4_4_ = 0xe;
      free(pcVar9);
    }
    if (bVar10) goto switchD_00108274_caseD_e;
    break;
  case 0xe:
switchD_00108274_caseD_e:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      bc_string_append(str,"<pre><code>");
      for (tmp_line = (char *)lines2; tmp_line != (char *)0x0; tmp_line = *(char **)tmp_line) {
        pcVar9 = blogc_htmlentities(*(char **)(tmp_line + 8));
        if (*(long *)tmp_line == 0) {
          bc_string_append_printf(str,"%s",pcVar9);
        }
        else {
          bc_string_append_printf(str,"%s%s",pcVar9,pcStack_b0);
        }
        free(pcVar9);
      }
      bc_string_append_printf(str,"</code></pre>%s",pcStack_b0);
      bc_slist_free_full(lines2,free);
      lines2 = (bc_slist_t *)0x0;
      free((void *)prefix_len);
      prefix_len = 0;
      l._4_4_ = 1;
      end = start;
    }
    else {
      l._4_4_ = 0xd;
      end = start;
    }
    break;
  case 0xf:
    if (start == start2 + 1) {
      if (l._3_1_ == lines._6_1_) {
        l._4_4_ = 0x10;
      }
      else {
        if (((l._3_1_ == ' ') || (l._3_1_ == '\t')) || (lines._6_1_ != '*')) goto LAB_00108f29;
        l._4_4_ = 0x18;
      }
    }
    else {
LAB_00108f29:
      if ((l._3_1_ != ' ') && (l._3_1_ != '\t')) {
        prefix_len = (size_t)bc_strndup(src + start2,start - start2);
        l._4_4_ = 0x12;
      }
    }
    break;
  case 0x10:
    if (l._3_1_ != lines._6_1_) {
      l._4_4_ = 0x18;
      break;
    }
    l._4_4_ = 0x11;
joined_r0x001099d2:
    if (bVar10) goto LAB_001080f1;
    break;
  case 0x11:
    if ((l._3_1_ != lines._6_1_) || (bVar10)) {
      if ((l._3_1_ == '\n') || ((l._3_1_ == '\r' || (bVar10)))) {
        bc_string_append_printf(str,"<hr />%s",pcStack_b0);
        l._4_4_ = 1;
        start2 = start;
        lines._6_1_ = '\0';
      }
      else {
        l._4_4_ = 0x18;
      }
    }
    break;
  case 0x12:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_198 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_1a0 = start;
        }
        else {
          local_1a0 = header_level;
        }
        local_198 = local_1a0;
      }
      eend = local_198;
      pcVar9 = bc_strndup(src + end,local_198 - end);
      sVar5 = strlen((char *)prefix_len);
      pcVar3 = bc_strdup_printf("%-*s",sVar5,"");
      _Var1 = bc_str_starts_with(pcVar9,(char *)prefix_len);
      if (_Var1) {
        if (rv != (bc_string_t *)0x0) {
          pbVar8 = bc_string_new();
          for (l_3 = (bc_slist_t *)rv; l_3 != (bc_slist_t *)0x0; l_3 = l_3->next) {
            if (l_3->next == (_bc_slist_t *)0x0) {
              bc_string_append_printf(pbVar8,"%s",l_3->data);
            }
            else {
              bc_string_append_printf(pbVar8,"%s%s",l_3->data,pcStack_b0);
            }
          }
          bc_slist_free_full((bc_slist_t *)rv,free);
          rv = (bc_string_t *)0x0;
          pcVar7 = blogc_content_parse_inline(pbVar8->str);
          bc_string_free(pbVar8,true);
          pcVar6 = bc_strdup(pcVar7);
          lines2 = bc_slist_append(lines2,pcVar6);
          free(pcVar7);
        }
        sVar5 = strlen((char *)prefix_len);
        pcVar7 = bc_strdup(pcVar9 + sVar5);
        rv = (bc_string_t *)bc_slist_append((bc_slist_t *)rv,pcVar7);
      }
      else {
        _Var1 = bc_str_starts_with(pcVar9,pcVar3);
        if (!_Var1) {
          l._4_4_ = 0x19;
          free(pcVar9);
          free(pcVar3);
          free((void *)prefix_len);
          bc_slist_free_full(lines2,free);
          bc_slist_free_full((bc_slist_t *)rv,free);
          goto joined_r0x0010937f;
        }
        sVar5 = strlen((char *)prefix_len);
        pcVar7 = bc_strdup(pcVar9 + sVar5);
        rv = (bc_string_t *)bc_slist_append((bc_slist_t *)rv,pcVar7);
      }
      free(pcVar9);
      free(pcVar3);
      l._4_4_ = 0x13;
    }
    if (bVar10) goto switchD_00108274_caseD_13;
    break;
  case 0x13:
switchD_00108274_caseD_13:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (rv != (bc_string_t *)0x0) {
        pbVar8 = bc_string_new();
        for (l_4 = (bc_slist_t *)rv; l_4 != (bc_slist_t *)0x0; l_4 = l_4->next) {
          if (l_4->next == (_bc_slist_t *)0x0) {
            bc_string_append_printf(pbVar8,"%s",l_4->data);
          }
          else {
            bc_string_append_printf(pbVar8,"%s%s",l_4->data,pcStack_b0);
          }
        }
        bc_slist_free_full((bc_slist_t *)rv,free);
        rv = (bc_string_t *)0x0;
        pcVar9 = blogc_content_parse_inline(pbVar8->str);
        bc_string_free(pbVar8,true);
        pcVar3 = bc_strdup(pcVar9);
        lines2 = bc_slist_append(lines2,pcVar3);
        free(pcVar9);
      }
      bc_string_append_printf(str,"<ul>%s",pcStack_b0);
      for (l_5 = lines2; l_5 != (bc_slist_t *)0x0; l_5 = l_5->next) {
        bc_string_append_printf(str,"<li>%s</li>%s",l_5->data,pcStack_b0);
      }
      bc_string_append_printf(str,"</ul>%s",pcStack_b0);
      bc_slist_free_full(lines2,free);
      lines2 = (bc_slist_t *)0x0;
      free((void *)prefix_len);
      prefix_len = 0;
      l._4_4_ = 1;
      end = start;
    }
    else {
      l._4_4_ = 0x12;
      end = start;
    }
    break;
  case 0x14:
    if ((l._3_1_ < '0') || ('9' < l._3_1_)) {
      if (l._3_1_ != '.') {
        l._4_4_ = 0x18;
        goto joined_r0x001099d2;
      }
      l._4_4_ = 0x15;
    }
    break;
  case 0x15:
    if ((l._3_1_ != ' ') && (l._3_1_ != '\t')) {
      tmp = (char *)(start - start2);
      l._4_4_ = 0x16;
      if ((l._3_1_ == '\n') || ((l._3_1_ == '\r' || (bVar10)))) goto switchD_00108274_caseD_16;
    }
    break;
  case 0x16:
switchD_00108274_caseD_16:
    if ((l._3_1_ == '\n') || ((l._3_1_ == '\r' || (bVar10)))) {
      if ((!bVar10) || ((l._3_1_ == '\n' || (local_1d8 = sVar2, l._3_1_ == '\r')))) {
        if (header_level == 0) {
          local_1e0 = start;
        }
        else {
          local_1e0 = header_level;
        }
        local_1d8 = local_1e0;
      }
      eend = local_1d8;
      pcVar9 = bc_strndup(src + end,local_1d8 - end);
      pcVar3 = bc_strdup_printf("%-*s",tmp,"");
      _Var1 = blogc_is_ordered_list_item(pcVar9,(size_t)tmp);
      if (_Var1) {
        if (rv != (bc_string_t *)0x0) {
          pbVar8 = bc_string_new();
          for (l_6 = (bc_slist_t *)rv; l_6 != (bc_slist_t *)0x0; l_6 = l_6->next) {
            if (l_6->next == (_bc_slist_t *)0x0) {
              bc_string_append_printf(pbVar8,"%s",l_6->data);
            }
            else {
              bc_string_append_printf(pbVar8,"%s%s",l_6->data,pcStack_b0);
            }
          }
          bc_slist_free_full((bc_slist_t *)rv,free);
          rv = (bc_string_t *)0x0;
          pcVar7 = blogc_content_parse_inline(pbVar8->str);
          bc_string_free(pbVar8,true);
          pcVar6 = bc_strdup(pcVar7);
          lines2 = bc_slist_append(lines2,pcVar6);
          free(pcVar7);
        }
        pcVar7 = bc_strdup(pcVar9 + (long)tmp);
        rv = (bc_string_t *)bc_slist_append((bc_slist_t *)rv,pcVar7);
      }
      else {
        _Var1 = bc_str_starts_with(pcVar9,pcVar3);
        if (!_Var1) {
          l._4_4_ = 0x19;
          free(pcVar9);
          free(pcVar3);
          free((void *)0x0);
          bc_slist_free_full(lines2,free);
          bc_slist_free_full((bc_slist_t *)rv,free);
          lines2 = (bc_slist_t *)0x0;
          goto joined_r0x001099d2;
        }
        pcVar7 = bc_strdup(pcVar9 + (long)tmp);
        rv = (bc_string_t *)bc_slist_append((bc_slist_t *)rv,pcVar7);
      }
      free(pcVar9);
      free(pcVar3);
      l._4_4_ = 0x17;
    }
    if (bVar10) goto switchD_00108274_caseD_17;
    break;
  case 0x17:
switchD_00108274_caseD_17:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      if (rv != (bc_string_t *)0x0) {
        pbVar8 = bc_string_new();
        for (l_7 = (bc_slist_t *)rv; l_7 != (bc_slist_t *)0x0; l_7 = l_7->next) {
          if (l_7->next == (_bc_slist_t *)0x0) {
            bc_string_append_printf(pbVar8,"%s",l_7->data);
          }
          else {
            bc_string_append_printf(pbVar8,"%s%s",l_7->data,pcStack_b0);
          }
        }
        bc_slist_free_full((bc_slist_t *)rv,free);
        rv = (bc_string_t *)0x0;
        pcVar9 = blogc_content_parse_inline(pbVar8->str);
        bc_string_free(pbVar8,true);
        pcVar3 = bc_strdup(pcVar9);
        lines2 = bc_slist_append(lines2,pcVar3);
        free(pcVar9);
      }
      bc_string_append_printf(str,"<ol>%s",pcStack_b0);
      for (local_128 = lines2; local_128 != (bc_slist_t *)0x0; local_128 = local_128->next) {
        bc_string_append_printf(str,"<li>%s</li>%s",local_128->data,pcStack_b0);
      }
      bc_string_append_printf(str,"</ol>%s",pcStack_b0);
      bc_slist_free_full(lines2,free);
      lines2 = (bc_slist_t *)0x0;
      free((void *)prefix_len);
      prefix_len = 0;
      l._4_4_ = 1;
      end = start;
    }
    else {
      l._4_4_ = 0x16;
      end = start;
    }
    break;
  case 0x18:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      l._4_4_ = 0x19;
      if (((!bVar10) || (l._3_1_ == '\n')) || (local_208 = sVar2, l._3_1_ == '\r')) {
        if (header_level == 0) {
          local_210 = start;
        }
        else {
          local_210 = header_level;
        }
        local_208 = local_210;
      }
      eend = local_208;
    }
    if (bVar10) goto switchD_00108274_caseD_19;
    break;
  case 0x19:
switchD_00108274_caseD_19:
    if (((l._3_1_ == '\n') || (l._3_1_ == '\r')) || (bVar10)) {
      pcVar9 = bc_strndup(src + start2,eend - start2);
      if ((description != (char **)0x0) && (*description == (char *)0x0)) {
        pcVar3 = blogc_fix_description(pcVar9);
        *description = pcVar3;
      }
      pcVar3 = blogc_content_parse_inline(pcVar9);
      bc_string_append_printf(str,"<p>%s</p>%s",pcVar3,pcStack_b0);
      free(pcVar3);
      free(pcVar9);
      l._4_4_ = 1;
      start2 = start;
    }
    else {
      l._4_4_ = 0x18;
    }
  }
  start = start + 1;
  goto LAB_001080f1;
}

Assistant:

char*
blogc_content_parse(const char *src, size_t *end_excerpt, char **first_header,
    char **description, char **endl, bc_slist_t **headers)
{
    // src is always nul-terminated.
    size_t src_len = strlen(src);

    size_t current = 0;
    size_t start = 0;
    size_t start2 = 0;
    size_t end = 0;
    size_t eend = 0;
    size_t real_end = 0;

    size_t header_level = 0;
    char *prefix = NULL;
    size_t prefix_len = 0;
    char *tmp = NULL;
    char *tmp2 = NULL;
    char *parsed = NULL;
    char *slug = NULL;

    char *line_ending = NULL;
    bool line_ending_found = false;
    if (endl != NULL) {
        if (*endl != NULL) {
            line_ending_found = true;
        }
        else {
            *endl = bc_malloc(3 * sizeof(char));
        }
        line_ending = *endl;
    }
    else {
        line_ending = bc_malloc(3 * sizeof(char));
    }

    // this isn't empty because we need some reasonable default value in the
    // unlikely case that we need to print some line ending before evaluating
    // the "real" value.
    if (!line_ending_found) {
        line_ending[0] = '\n';
        line_ending[1] = '\0';
    }

    char d = '\0';

    bc_slist_t *lines = NULL;
    bc_slist_t *lines2 = NULL;

    bc_string_t *rv = bc_string_new();
    bc_string_t *tmp_str = NULL;

    blogc_content_parser_state_t state = CONTENT_START_LINE;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        if (c == '\n' || c == '\r') {
            if ((current + 1) < src_len) {
                if ((c == '\n' && src[current + 1] == '\r') ||
                    (c == '\r' && src[current + 1] == '\n'))
                {
                    if (!line_ending_found) {
                        line_ending[0] = c;
                        line_ending[1] = src[current + 1];
                        line_ending[2] = '\0';
                        line_ending_found = true;
                    }
                    real_end = current;
                    c = src[++current];
                    is_last = current == src_len - 1;
                }
            }
            if (!line_ending_found) {
                line_ending[0] = c;
                line_ending[1] = '\0';
                line_ending_found = true;
            }
        }

        switch (state) {

            case CONTENT_START_LINE:
                if (c == '\n' || c == '\r' || is_last)
                    break;
                start = current;
                if (c == '.') {
                    if (end_excerpt != NULL) {
                        eend = rv->len;  // fuck it
                        state = CONTENT_EXCERPT;
                        break;
                    }
                }
                if (c == '#') {
                    header_level = 1;
                    state = CONTENT_HEADER;
                    break;
                }
                if (c == '*' || c == '+' || c == '-') {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS;
                    d = c;
                    break;
                }
                if (c >= '0' && c <= '9') {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    start2 = current;
                    state = CONTENT_CODE;
                    break;
                }
                if (c == '<') {
                    state = CONTENT_HTML;
                    break;
                }
                if (c == '>') {
                    state = CONTENT_BLOCKQUOTE;
                    start2 = current;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT:
                if (end_excerpt != NULL) {
                    if (c == '.')
                        break;
                    if (c == '\n' || c == '\r') {
                        state = CONTENT_EXCERPT_END;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT_END:
                if (end_excerpt != NULL) {
                    if (c == '\n' || c == '\r') {
                        *end_excerpt = eend;
                        state = CONTENT_START_LINE;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH_END;
                break;

            case CONTENT_HEADER:
                if (c == '#') {
                    header_level += 1;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    state = CONTENT_HEADER_TITLE_START;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HEADER_TITLE_START:
                if (c == ' ' || c == '\t')
                    break;
                start = current;
                if (c != '\n' && c != '\r') {
                    state = CONTENT_HEADER_TITLE;
                    break;
                }

            case CONTENT_HEADER_TITLE:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start, end - start);
                    if (first_header != NULL && *first_header == NULL)
                        *first_header = blogc_htmlentities(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    slug = blogc_slugify(tmp);
                    if (headers != NULL)
                        *headers = blogc_toctree_append(*headers, header_level, slug, parsed);
                    if (slug == NULL)
                        bc_string_append_printf(rv, "<h%d>%s</h%d>%s",
                            header_level, parsed, header_level, line_ending);
                    else
                        bc_string_append_printf(rv, "<h%d id=\"%s\">%s</h%d>%s",
                            header_level, slug, parsed, header_level,
                            line_ending);
                    free(slug);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                break;

            case CONTENT_HTML:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_HTML_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_HTML_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    bc_string_append_printf(rv, "%s%s", tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_HTML;
                break;

            case CONTENT_BLOCKQUOTE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_BLOCKQUOTE_START;
                break;

            case CONTENT_BLOCKQUOTE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_BLOCKQUOTE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        if (is_last) {
                            free(tmp);
                            tmp = NULL;
                            continue;
                        }
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_BLOCKQUOTE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp_str = bc_string_new();
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(tmp_str, "%s%s", l->data,
                            line_ending);
                    // do not propagate title and description to blockquote parsing,
                    // because we just want paragraphs from first level of
                    // content.
                    tmp = blogc_content_parse(tmp_str->str, NULL, NULL, NULL, endl, NULL);
                    bc_string_append_printf(rv, "<blockquote>%s</blockquote>%s",
                        tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    bc_string_free(tmp_str, true);
                    tmp_str = NULL;
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_BLOCKQUOTE_START;
                }
                break;

            case CONTENT_CODE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_CODE_START;
                break;

            case CONTENT_CODE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_CODE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        free(tmp);
                        tmp = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_CODE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append(rv, "<pre><code>");
                    for (bc_slist_t *l = lines; l != NULL; l = l->next) {
                        char *tmp_line = blogc_htmlentities(l->data);
                        if (l->next == NULL)
                            bc_string_append_printf(rv, "%s", tmp_line);
                        else
                            bc_string_append_printf(rv, "%s%s", tmp_line,
                                line_ending);
                        free(tmp_line);
                    }
                    bc_string_append_printf(rv, "</code></pre>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_CODE_START;
                }
                break;

            case CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS:
                if (current == start+1) {
                    if (c == d) { // horizontal rule or '**' emphasis
                        state = CONTENT_HORIZONTAL_RULE_OR_EMPHASIS;
                        break;
                    }
                    else if (c != ' ' && c != '\t' && d == '*') { // is '*' emphasis
                        state = CONTENT_PARAGRAPH;
                        break;
                    }
                }
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_UNORDERED_LIST_START;
                break;

            case CONTENT_HORIZONTAL_RULE_OR_EMPHASIS:
                // 3rd '-' or '*' required for a horizontal rule
                if (c == d) {
                    state = CONTENT_HORIZONTAL_RULE;
                    if (is_last)
                        continue;
                    break;
                }
                // is '**' emphasis
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HORIZONTAL_RULE:
                if (c == d && !is_last) {
                    break;
                }
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append_printf(rv, "<hr />%s", line_ending);
                    state = CONTENT_START_LINE;
                    start = current;
                    d = '\0';
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_UNORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", strlen(prefix), "");
                    if (bc_str_starts_with(tmp, prefix)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_UNORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_UNORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ul>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ul>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_START;
                }
                break;

            case CONTENT_ORDERED_LIST:
                if (c >= '0' && c <= '9')
                    break;
                if (c == '.') {
                    state = CONTENT_ORDERED_LIST_SPACE;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                if (is_last)
                    continue;
                break;

            case CONTENT_ORDERED_LIST_SPACE:
                if (c == ' ' || c == '\t')
                    break;
                prefix_len = current - start;
                state = CONTENT_ORDERED_LIST_START;
                if (c != '\n' && c != '\r' && !is_last)
                    break;

            case CONTENT_ORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", prefix_len, "");
                    if (blogc_is_ordered_list_item(tmp, prefix_len)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(parsed);
                        parsed = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_ORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_ORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ol>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ol>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST_START;
                }
                break;

            case CONTENT_PARAGRAPH:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_PARAGRAPH_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_PARAGRAPH_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    if (description != NULL && *description == NULL)
                        *description = blogc_fix_description(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    bc_string_append_printf(rv, "<p>%s</p>%s", parsed,
                        line_ending);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_PARAGRAPH;
                break;

        }

        current++;
    }

    if (endl == NULL) {
        free(line_ending);
    }

    return bc_string_free(rv, false);
}